

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfCloseTiledInputFile(ImfTiledInputFile *in)

{
  TiledRgbaInputFile *pTVar1;
  ImfTiledInputFile *in_RDI;
  exception *e;
  
  pTVar1 = anon_unknown.dwarf_572a3::infile(in_RDI);
  if (pTVar1 != (TiledRgbaInputFile *)0x0) {
    (*pTVar1->_vptr_TiledRgbaInputFile[1])();
  }
  return 1;
}

Assistant:

int
ImfCloseTiledInputFile (ImfTiledInputFile* in)
{
    try
    {
        delete infile (in);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}